

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void * __thiscall
google::protobuf::internal::ThreadSafeArena::AllocateAlignedFallback
          (ThreadSafeArena *this,size_t n,type_info *type)

{
  type_info *ptVar1;
  bool bVar2;
  ThreadCache *me;
  SerialArena *this_00;
  AllocationPolicy *pAVar3;
  void *pvVar4;
  SerialArena *local_30;
  SerialArena *arena;
  type_info *type_local;
  size_t n_local;
  ThreadSafeArena *this_local;
  
  arena = (SerialArena *)type;
  type_local = (type_info *)n;
  n_local = (size_t)this;
  bVar2 = TaggedAllocationPolicyPtr::should_record_allocs((TaggedAllocationPolicyPtr *)(this + 8));
  if (bVar2) {
    TaggedAllocationPolicyPtr::RecordAlloc
              ((TaggedAllocationPolicyPtr *)(this + 8),(type_info *)arena,(size_t)type_local);
    bVar2 = GetSerialArenaFast(this,&local_30);
    ptVar1 = type_local;
    if (bVar2) {
      pAVar3 = TaggedAllocationPolicyPtr::get((TaggedAllocationPolicyPtr *)(this + 8));
      pvVar4 = SerialArena::AllocateAligned(local_30,(size_t)ptVar1,pAVar3);
      return pvVar4;
    }
  }
  me = thread_cache();
  this_00 = GetSerialArenaFallback(this,me);
  ptVar1 = type_local;
  pAVar3 = TaggedAllocationPolicyPtr::get((TaggedAllocationPolicyPtr *)(this + 8));
  pvVar4 = SerialArena::AllocateAligned(this_00,(size_t)ptVar1,pAVar3);
  return pvVar4;
}

Assistant:

PROTOBUF_NOINLINE
void* ThreadSafeArena::AllocateAlignedFallback(size_t n,
                                               const std::type_info* type) {
  if (alloc_policy_.should_record_allocs()) {
    alloc_policy_.RecordAlloc(type, n);
    SerialArena* arena;
    if (PROTOBUF_PREDICT_TRUE(GetSerialArenaFast(&arena))) {
      return arena->AllocateAligned(n, alloc_policy_.get());
    }
  }
  return GetSerialArenaFallback(&thread_cache())
      ->AllocateAligned(n, alloc_policy_.get());
}